

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

int __thiscall Parser::access(Parser *this,char *__name,int __type)

{
  undefined4 in_register_00000014;
  ptr<Expression> accessValue;
  undefined1 local_49;
  ElementAccess *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  ElementAccess *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  consume((Parser *)__name);
  expression((Parser *)&stack0xffffffffffffffd8);
  consume((Parser *)__name,RightBrack,"\']\'");
  local_38 = (ElementAccess *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ElementAccess,std::allocator<ElementAccess>,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
            (&local_30,&local_38,(allocator<ElementAccess> *)&local_49,
             (shared_ptr<Expression> *)CONCAT44(in_register_00000014,__type),
             (shared_ptr<Expression> *)&stack0xffffffffffffffd8);
  local_48 = local_38;
  local_40 = local_30._M_pi;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
    }
  }
  postfix(this,(ptr<Expression> *)__name);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  return (int)this;
}

Assistant:

ptr<Expression> Parser::access(ptr<Expression> callee) {
    consume();
    ptr<Expression> accessValue = expression();
    consume(TokenType::RightBrack, "']'");
    ptr<Expression> expr = make<ElementAccess>(callee, accessValue);
    return postfix(expr);
}